

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void terminal_print_arrow(EditLine *el,wchar_t *name)

{
  int iVar1;
  long lVar2;
  keymacro_value_t *val;
  
  val = &((el->el_terminal).t_fkey)->fun;
  lVar2 = 7;
  do {
    if (*name == L'\0') {
LAB_00111800:
      if (*(wchar_t *)(val + 1) != L'\x02') {
        keymacro_kprint(el,val[-2].str,val,*(wchar_t *)(val + 1));
      }
    }
    else {
      iVar1 = wcscmp(name,val[-2].str);
      if (iVar1 == 0) goto LAB_00111800;
    }
    val = val + 4;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return;
    }
  } while( true );
}

Assistant:

libedit_private void
terminal_print_arrow(EditLine *el, const wchar_t *name)
{
	int i;
	funckey_t *arrow = el->el_terminal.t_fkey;

	for (i = 0; i < A_K_NKEYS; i++)
		if (*name == '\0' || wcscmp(name, arrow[i].name) == 0)
			if (arrow[i].type != XK_NOD)
				keymacro_kprint(el, arrow[i].name,
				    &arrow[i].fun, arrow[i].type);
}